

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsIterationStaticSlices(void)

{
  initializer_list<int> __l;
  bool bVar1;
  size_t sVar2;
  reference piVar3;
  ostream *poVar4;
  StaticSliceIterator<2UL> *other;
  Span<const_int,_18446744073709551615UL> SVar5;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>_>
  IVar6;
  undefined1 local_c0 [8];
  Span<const_int,_2UL> row;
  StaticSliceIterator<2UL> __end1;
  StaticSliceIterator<2UL> __begin1;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>_>
  *__range1;
  pointer ptStack_80;
  int counter;
  Span<const_int,_18446744073709551615UL> span;
  allocator<int> local_59;
  int local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_58[0] = 1;
  local_58[1] = 2;
  local_58[2] = 3;
  local_58[3] = 4;
  local_58[4] = 5;
  local_58[5] = 6;
  local_38 = local_58;
  local_30 = 6;
  std::allocator<int>::allocator(&local_59);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_59);
  std::allocator<int>::~allocator(&local_59);
  SVar5 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  span.m_ptr = (pointer)SVar5.m_size.m_size;
  ptStack_80 = SVar5.m_ptr;
  __range1._4_4_ = 0;
  IVar6 = MILBlob::Util::Span<int_const,18446744073709551615ul>::IterateSlices<2ul>
                    ((Span<int_const,18446744073709551615ul> *)&stack0xffffffffffffff80);
  __begin1 = IVar6.m_begin.m_ptr;
  __end1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::
           IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>_>
           ::begin((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>_>
                    *)&__begin1);
  row._8_8_ = MILBlob::Util::Span<const_int,_18446744073709551615UL>::
              IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>_>
              ::end((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>_>
                     *)&__begin1);
  do {
    other = (StaticSliceIterator<2UL> *)&row.field_0x8;
    bVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>::
            operator!=(&__end1,other);
    if (!bVar1) {
      if (__range1._4_4_ == 6) {
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x254);
        poVar4 = std::operator<<(poVar4,": error: ");
        poVar4 = std::operator<<(poVar4,"(counter) == (6)");
        poVar4 = std::operator<<(poVar4," was false, expected true.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
      }
LAB_001c613d:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28)
      ;
      return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
    }
    local_c0 = (undefined1  [8])
               MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>::
               operator*((Span<const_int,_2UL> *)&__end1,other);
    sVar2 = MILBlob::Util::Span<const_int,_2UL>::Size((Span<const_int,_2UL> *)local_c0);
    if (sVar2 != 2) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x24e);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"(row.Size()) == (size_t(2))");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      goto LAB_001c613d;
    }
    piVar3 = MILBlob::Util::Span<const_int,_2UL>::Get<0UL,_0>((Span<const_int,_2UL> *)local_c0);
    if (*piVar3 != __range1._4_4_ + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x24f);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"(row.Get<0>()) == (counter + 1)");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      goto LAB_001c613d;
    }
    piVar3 = MILBlob::Util::Span<const_int,_2UL>::Get<1UL,_0>((Span<const_int,_2UL> *)local_c0);
    if (*piVar3 != __range1._4_4_ + 2) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x250);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"(row.Get<1>()) == (counter + 2)");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      goto LAB_001c613d;
    }
    __range1._4_4_ = __range1._4_4_ + 2;
    MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>::operator++
              (&__end1);
  } while( true );
}

Assistant:

int testSpanTestsIterationStaticSlices()
{
    const std::vector<int> values = {1, 2, 3, 4, 5, 6};
    auto span = MakeSpan(values);

    // iterate 3 values at a time
    int counter = 0;
    for (auto row : span.IterateSlices<2>()) {
        ML_ASSERT_EQ(row.Size(), size_t(2));
        ML_ASSERT_EQ(row.Get<0>(), counter + 1);
        ML_ASSERT_EQ(row.Get<1>(), counter + 2);

        counter += 2;
    }
    ML_ASSERT_EQ(counter, 6);

    return 0;
}